

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O2

Parser * xLearn::CreateParser(char *format_name)

{
  ObjectCreatorRegistry_xLearn_parser_registry *this;
  Parser *pPVar1;
  allocator local_39;
  string local_38;
  
  this = GetRegistry_xLearn_parser_registry();
  std::__cxx11::string::string((string *)&local_38,format_name,&local_39);
  pPVar1 = ObjectCreatorRegistry_xLearn_parser_registry::CreateObject(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pPVar1;
}

Assistant:

Parser* CreateParser(const char* format_name) {
  return CREATE_PARSER(format_name);
}